

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentfragment.cpp
# Opt level: O1

void __thiscall
QTextDocumentFragmentPrivate::insert(QTextDocumentFragmentPrivate *this,QTextCursor *_cursor)

{
  byte bVar1;
  int iVar2;
  QTextCursorPrivate *pQVar3;
  QTextDocumentPrivate *this_00;
  bool bVar4;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *dst;
  long in_FS_OFFSET;
  QTextCursor sourceCursor;
  QTextCopyHelper local_a0;
  QTextCursor local_50;
  QTextFormat local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = QTextCursor::isNull(_cursor);
  if (!bVar4) {
    pQVar3 = (_cursor->d).d.ptr;
    if ((pQVar3 != (QTextCursorPrivate *)0x0) &&
       ((__atomic_base<int>)
        *(__int_type *)
         &(pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value != (__atomic_base<int>)0x1)) {
      QSharedDataPointer<QTextCursorPrivate>::detach_helper(&_cursor->d);
    }
    this_00 = ((_cursor->d).d.ptr)->priv;
    iVar2 = this_00->editBlock;
    this_00->editBlock = iVar2 + 1;
    if (iVar2 == 0) {
      this_00->revision = this_00->revision + 1;
    }
    dst = (EVP_PKEY_CTX *)&local_50;
    local_50.d.d.ptr = (QSharedDataPointer<QTextCursorPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    QTextCursor::QTextCursor((QTextCursor *)dst,this->doc);
    QTextCursor::movePosition((QTextCursor *)dst,End,KeepAnchor,1);
    bVar1 = this->field_0x10;
    QTextCursor::charFormat((QTextCursor *)&local_48);
    QTextCopyHelper::QTextCopyHelper
              (&local_a0,(QTextCursor *)dst,_cursor,(bool)(bVar1 & 1),(QTextCharFormat *)&local_48);
    QTextCopyHelper::copy(&local_a0,dst,src);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2(&local_a0.objectIndexMap.d);
    if (&(local_a0.originalText.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a0.originalText.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a0.originalText.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if (((local_a0.originalText.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i == 0) {
        QArrayData::deallocate(&(local_a0.originalText.d.d)->super_QArrayData,2,0x10);
      }
    }
    QTextCursor::~QTextCursor(&local_a0.cursor);
    QTextFormat::~QTextFormat(&local_48);
    QTextDocumentPrivate::endEditBlock(this_00);
    QTextCursor::~QTextCursor(&local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextDocumentFragmentPrivate::insert(QTextCursor &_cursor) const
{
    if (_cursor.isNull())
        return;

    QTextDocumentPrivate *destPieceTable = _cursor.d->priv;
    destPieceTable->beginEditBlock();

    QTextCursor sourceCursor(doc);
    sourceCursor.movePosition(QTextCursor::End, QTextCursor::KeepAnchor);
    QTextCopyHelper(sourceCursor, _cursor, importedFromPlainText, _cursor.charFormat()).copy();

    destPieceTable->endEditBlock();
}